

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

DynamicType *
Js::JavascriptOperators::EnsureObjectLiteralType
          (ScriptContext *scriptContext,PropertyIdArray *propIds,Type *literalType)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  DynamicType *pDVar6;
  undefined4 *puVar7;
  uint16 requestedInlineSlotCapacity;
  DynamicTypeHandler *pDVar8;
  uint16 requestedInlineSlotCapacity_00;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  pDVar6 = literalType->ptr;
  if (pDVar6 == (DynamicType *)0x0) {
    bVar4 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    requestedInlineSlotCapacity = (uint16)propIds->count;
    if (bVar4) {
      pDVar6 = JavascriptLibrary::GetObjectHeaderInlinedLiteralType
                         (this,requestedInlineSlotCapacity);
    }
    else {
      requestedInlineSlotCapacity_00 = 0x10;
      if (propIds->count < 0x10) {
        requestedInlineSlotCapacity_00 = requestedInlineSlotCapacity;
      }
      pDVar6 = JavascriptLibrary::GetObjectLiteralType(this,requestedInlineSlotCapacity_00);
    }
    pDVar6 = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext,pDVar6,propIds,false);
    Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierSet(literalType,pDVar6);
  }
  else if (pDVar6->isShared == false) {
    DynamicType::ShareType(pDVar6);
  }
  uVar5 = GetLiteralInlineSlotCapacity(propIds);
  pDVar8 = (pDVar6->typeHandler).ptr;
  if (uVar5 != pDVar8->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16fe,
                                "(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar4) goto LAB_009a1308;
    *puVar7 = 0;
    pDVar8 = (pDVar6->typeHandler).ptr;
  }
  if (pDVar8->slotCapacity < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16ff,"(newType->GetTypeHandler()->GetSlotCapacity() >= 0)",
                                "newType->GetTypeHandler()->GetSlotCapacity() >= 0");
    if (!bVar4) goto LAB_009a1308;
    *puVar7 = 0;
  }
  uVar5 = GetLiteralSlotCapacity(propIds);
  if (uVar5 != ((pDVar6->typeHandler).ptr)->slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1700,
                                "(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity())"
                                ,
                                "GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity()"
                               );
    if (!bVar4) {
LAB_009a1308:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pTVar2->noJsReentrancy = bVar1;
  return pDVar6;
}

Assistant:

DynamicType *
    JavascriptOperators::EnsureObjectLiteralType(ScriptContext* scriptContext, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(EnsureObjectLiteralType, reentrancylock, scriptContext->GetThreadContext());
        DynamicType * newType = *literalType;
        if (newType != nullptr)
        {
            if (!newType->GetIsShared())
            {
                newType->ShareType();
            }
        }
        else
        {
            DynamicType* objectType =
                FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                    ?   scriptContext->GetLibrary()->GetObjectHeaderInlinedLiteralType((uint16)propIds->count)
                    :   scriptContext->GetLibrary()->GetObjectLiteralType(
                            static_cast<PropertyIndex>(
                                min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
            newType = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext, objectType, propIds, false);
            *literalType = newType;
        }

        Assert(scriptContext);
        Assert(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(newType->GetTypeHandler()->GetSlotCapacity() >= 0);
        Assert(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity());
        return newType;
        JIT_HELPER_END(EnsureObjectLiteralType);
    }